

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

bool Diligent::LinuxFileSystem::IsDirectory(Char *strPath)

{
  int iVar1;
  char *__file;
  undefined1 local_e0 [8];
  stat StatBuff;
  allocator local_39;
  undefined1 local_38 [8];
  string path;
  Char *strPath_local;
  
  path.field_2._8_8_ = strPath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,strPath,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  BasicFileSystem::CorrectSlashes((String *)local_38,'\0');
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_e0);
  strPath_local._7_1_ = iVar1 == 0 && ((uint)StatBuff.st_nlink & 0xf000) == 0x4000;
  std::__cxx11::string::~string((string *)local_38);
  return strPath_local._7_1_;
}

Assistant:

bool LinuxFileSystem::IsDirectory(const Char* strPath)
{
    std::string path{strPath};
    CorrectSlashes(path);

    struct stat StatBuff;
    if (stat(path.c_str(), &StatBuff) != 0)
        return false;

    return S_ISDIR(StatBuff.st_mode);
}